

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementInstancer.cpp
# Opt level: O3

void __thiscall
Rml::ElementInstancerText::ReleaseElement(ElementInstancerText *this,Element *element)

{
  _func_int **pp_Var1;
  ElementInstancer *pEVar2;
  code *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  _func_int **pp_Var6;
  
  if (((element_instancer_pools._8_8_ != 0) ||
      (bVar5 = Assert("Resource used before it was initialized, or after it was shut down.",
                      "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                      ,0x46), bVar5)) &&
     (((uVar4 = element_instancer_pools._8_8_, element != (Element *)0x0 &&
       ((element->super_ScriptInterface).super_Releasable._vptr_Releasable ==
        (_func_int **)&PTR__ElementText_0032fbc8)) ||
      (bVar5 = Assert("RMLUI_ASSERT(dynamic_cast<Derived>(base_instance))",
                      "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/../../Include/RmlUi/Core/Traits.h"
                      ,0xad), bVar5)))) {
    *(int *)(uVar4 + 0x48) = *(int *)(uVar4 + 0x48) + -1;
    ElementText::~ElementText((ElementText *)element);
    pp_Var1 = *(_func_int ***)((long)&element[1].id.field_2 + 8);
    pEVar2 = element[1].instancer;
    if (pp_Var1 == (_func_int **)0x0) {
      pp_Var6 = (_func_int **)(uVar4 + 0x38);
      if ((*(Element **)(uVar4 + 0x38) != element) &&
         (bVar5 = Assert("RMLUI_ASSERT(first_allocated_node == object)",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Pool.inl"
                         ,0xa5), !bVar5)) goto LAB_0022b741;
    }
    else {
      pp_Var6 = pp_Var1 + 0x40;
    }
    *pp_Var6 = (_func_int *)pEVar2;
    if (pEVar2 != (ElementInstancer *)0x0) {
      pEVar2[0x3f]._vptr_ElementInstancer = pp_Var1;
    }
    pEVar2 = *(ElementInstancer **)(uVar4 + 0x40);
    *(undefined8 *)((long)&element[1].id.field_2 + 8) = 0;
    element[1].instancer = pEVar2;
    *(Element **)(uVar4 + 0x40) = element;
    return;
  }
LAB_0022b741:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void ElementInstancerText::ReleaseElement(Element* element)
{
	element_instancer_pools->pool_text_default.DestroyAndDeallocate(rmlui_static_cast<ElementText*>(element));
}